

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void ggml_compute_forward_argmax(ggml_compute_params *params,ggml_tensor *dst)

{
  float fVar1;
  ggml_tensor *pgVar2;
  long lVar3;
  size_t sVar4;
  size_t sVar5;
  void *pvVar6;
  ulong uVar7;
  undefined4 uVar8;
  uint uVar9;
  void *pvVar10;
  long lVar11;
  undefined4 uVar12;
  undefined1 auVar13 [16];
  
  pgVar2 = dst->src[0];
  if (pgVar2->type == GGML_TYPE_F32) {
    if ((params->ith == 0) && (lVar3 = pgVar2->ne[1], 0 < lVar3)) {
      sVar4 = pgVar2->nb[1];
      sVar5 = dst->nb[0];
      pvVar10 = pgVar2->data;
      pvVar6 = dst->data;
      uVar9 = (uint)pgVar2->ne[0];
      lVar11 = 0;
      do {
        uVar12 = 0;
        if (0 < (int)uVar9) {
          uVar7 = 0;
          uVar12 = 0;
          auVar13 = SUB6416(ZEXT464(0xff800000),0);
          do {
            fVar1 = *(float *)((long)pvVar10 + uVar7 * 4);
            auVar13 = vmaxss_avx(auVar13,ZEXT416((uint)fVar1));
            uVar8 = (int)uVar7;
            if (auVar13._0_4_ != fVar1) {
              uVar8 = uVar12;
            }
            if (!NAN(auVar13._0_4_) && !NAN(fVar1)) {
              uVar12 = uVar8;
            }
            uVar7 = uVar7 + 1;
          } while ((uVar9 & 0x7fffffff) != uVar7);
        }
        *(undefined4 *)((long)pvVar6 + lVar11 * sVar5) = uVar12;
        lVar11 = lVar11 + 1;
        pvVar10 = (void *)((long)pvVar10 + sVar4);
      } while (lVar11 != lVar3);
    }
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,0x848,"fatal error");
}

Assistant:

void ggml_compute_forward_argmax(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_argmax_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}